

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  __mode_t __mode;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uv_dirent_type_t uVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  void *pvVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *p_Var14;
  ssize_t sVar15;
  size_t sVar16;
  size_t sVar17;
  dirent64 *dent;
  char *pcVar18;
  DIR *pDVar19;
  ssize_t sVar20;
  _func_void_uv__work_ptr *p_Var21;
  long lVar22;
  code *pcVar23;
  _func_void_uv__work_ptr_int *p_Var24;
  _func_void_uv__work_ptr_int *p_Var25;
  _func_void_uv__work_ptr_int *p_Var26;
  ulong uVar27;
  size_t sVar28;
  uint minor;
  pollfd pfd;
  stat dst_statsbuf;
  uint major;
  utsname u;
  _func_void_uv__work_ptr_int *local_2208;
  int local_21f0;
  int local_21ec;
  stat64 local_21d0;
  stat64 local_2140;
  statfs64 local_20b0;
  undefined1 local_2038 [16];
  void *local_2028;
  void *local_2020;
  uint local_2018;
  int iStack_2014;
  uv_loop_s *local_2010;
  void *local_2008;
  __fsid_t local_2000;
  uv_fs_type local_1ff8;
  char acStack_1ff4 [4];
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *local_1fc8;
  char local_1fb6 [142];
  char *local_1f28;
  uint local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar5 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                     (ulong)*(uint *)(w[-2].wq + 1));
      break;
    case 2:
      iVar5 = uv__close_nocancel(*(int *)w[-2].wq);
      if (iVar5 == -1) {
        iVar5 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      uVar9 = uv__getiovmax();
      if (uVar9 < *(uint *)((long)w[-2].wq + 0xc)) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar9;
      }
      p_Var24 = w[-1].done;
      iVar5 = *(int *)((long)w[-2].wq + 0xc);
      if ((long)p_Var24 < 0) {
        if (iVar5 == 1) {
          p_Var24 = (_func_void_uv__work_ptr_int *)
                    read(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          p_Var24 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar5)
          ;
        }
      }
      else if (iVar5 == 1) {
        p_Var24 = (_func_void_uv__work_ptr_int *)
                  pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                          (__off64_t)p_Var24);
      }
      else {
        if (uv__fs_read_no_preadv != '\x01') {
          p_Var24 = (_func_void_uv__work_ptr_int *)
                    uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar5,(int64_t)p_Var24);
          if ((p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
             (p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26))
          goto LAB_00114db8;
          uv__fs_read_no_preadv = '\x01';
        }
        uVar27 = (ulong)*(uint *)((long)w[-2].wq + 0xc);
        if (uVar27 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/fs.c"
                        ,0x1a4,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar5 = *(int *)w[-2].wq;
        p_Var26 = w[-1].done;
        p_Var14 = w[-1].work;
        p_Var21 = p_Var14 + uVar27 * 0x10;
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar27 = 0;
          do {
            do {
              sVar15 = pread64(iVar5,(void *)(*(long *)p_Var14 + uVar27),
                               *(long *)(p_Var14 + 8) - uVar27,(__off64_t)(p_Var26 + (long)p_Var24))
              ;
              if (sVar15 != -1) break;
            } while (*puVar11 == 4);
            if (sVar15 == 0) goto LAB_00114db8;
            if (sVar15 == -1 && p_Var24 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var24 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar11;
              goto LAB_00114db8;
            }
            if (sVar15 == -1) goto LAB_00114db8;
            uVar27 = uVar27 + sVar15;
            p_Var24 = p_Var24 + sVar15;
          } while (uVar27 < *(ulong *)(p_Var14 + 8));
          p_Var14 = p_Var14 + 0x10;
        } while (p_Var14 != p_Var21);
      }
LAB_00114db8:
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0011491e;
    case 4:
      uVar6 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      if (uVar9 == 0) {
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar7 = uVar6;
          if (uVar9 < uVar6) {
            uVar7 = uVar9;
          }
          *(uint *)((long)w[-2].wq + 0xc) = uVar7;
          do {
            p_Var26 = w[-1].done;
            iVar5 = *(int *)((long)w[-2].wq + 0xc);
            if ((long)p_Var26 < 0) {
              __iovec = (iovec *)w[-1].work;
              if (iVar5 == 1) {
                p_Var26 = (_func_void_uv__work_ptr_int *)
                          write(*(int *)w[-2].wq,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                p_Var26 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,__iovec,iVar5);
              }
            }
            else {
              if (iVar5 == 1) {
                iVar5 = *(int *)w[-2].wq;
                pvVar12 = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev != '\x01') {
                  p_Var26 = (_func_void_uv__work_ptr_int *)
                            uv__pwritev(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar5,(int64_t)p_Var26)
                  ;
                  if ((p_Var26 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
                     (p_Var26 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26)
                     ) goto LAB_00114322;
                  uv__fs_write_no_pwritev = '\x01';
                }
                iVar5 = *(int *)w[-2].wq;
                pvVar12 = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
                p_Var26 = w[-1].done;
              }
              p_Var26 = (_func_void_uv__work_ptr_int *)
                        pwrite64(iVar5,pvVar12,sVar13,(__off64_t)p_Var26);
            }
LAB_00114322:
          } while (((long)p_Var26 < 0) && (*puVar11 == 4));
          if ((long)p_Var26 < 1) {
            if (p_Var24 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var24 = p_Var26;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)p_Var26;
          }
          pcVar23 = w[-1].work + 8;
          uVar7 = 0;
          p_Var25 = p_Var26;
          do {
            p_Var2 = *(_func_void_uv__work_ptr_int **)pcVar23;
            if (p_Var25 < p_Var2) {
              *(_func_void_uv__work_ptr_int **)(pcVar23 + -8) = p_Var25 + *(ulong *)(pcVar23 + -8);
              *(ulong *)pcVar23 = *(ulong *)pcVar23 - (long)p_Var25;
              break;
            }
            uVar7 = uVar7 + 1;
            pcVar23 = pcVar23 + 0x10;
            p_Var25 = p_Var25 + -(long)p_Var2;
          } while (p_Var25 != (_func_void_uv__work_ptr_int *)0x0);
          *(uint *)((long)w[-2].wq + 0xc) = uVar7;
          w[-1].work = w[-1].work + (ulong)uVar7 * 0x10;
          p_Var24 = p_Var24 + (long)p_Var26;
          uVar9 = uVar9 - uVar7;
        } while (uVar9 != 0);
      }
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0011491e;
    case 5:
      iVar5 = *(int *)w[-2].wq;
      iVar10 = *(int *)((long)w[-2].wq + 4);
      local_2140.st_dev = (__dev_t)w[-1].done;
      if (uv__fs_sendfile_no_copy_file_range_support == '\0') {
        sVar20 = uv__fs_copy_file_range
                           (iVar10,(off_t *)&local_2140,iVar5,(off_t *)0x0,(size_t)w[1].done,0);
        if (sVar20 == -1) {
          if (*puVar11 == 0xd) {
            iVar4 = fstatfs64(iVar10,(statfs64 *)&local_21d0);
            if ((iVar4 != -1) &&
               (CONCAT26(local_21d0.st_dev._6_2_,
                         CONCAT24(local_21d0.st_dev._4_2_,(int)local_21d0.st_dev)) == 0xc36400)) {
              uVar9 = uv__kernel_version_cached_version;
              if (uv__kernel_version_cached_version == 0) {
                iVar4 = uname((utsname *)local_2038);
                if (iVar4 == -1) {
                  uVar9 = 0;
                }
                else {
                  uVar9 = 0;
                  iVar4 = sscanf(local_1fb6,"%u.%u.%u",&local_20b0);
                  if (iVar4 == 3) {
                    uVar9 = local_21ec * 0x100 + (int)local_20b0.f_type * 0x10000 + local_21f0;
                    uv__kernel_version_cached_version = uVar9;
                  }
                }
              }
              if (uVar9 < 0x41400) goto LAB_00114c8a;
            }
          }
          else if (*puVar11 == 0x26) {
LAB_00114c8a:
            *puVar11 = 0;
            uv__fs_sendfile_no_copy_file_range_support = '\x01';
            goto LAB_00113e71;
          }
          if ((*puVar11 == 0x5f) || (*puVar11 == 0x12)) {
            *puVar11 = 0;
            goto LAB_00113e71;
          }
          goto LAB_00113e91;
        }
      }
      else {
LAB_00113e71:
        sVar15 = sendfile64(iVar5,iVar10,(__off64_t *)&local_2140,(size_t)w[1].done);
        if (sVar15 == -1) {
LAB_00113e91:
          if ((long)local_2140.st_dev <= (long)w[-1].done) {
            uVar9 = *puVar11;
            if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) ||
               (p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar9 == 0x58)) {
              *puVar11 = 0;
              p_Var26 = w[1].done;
              local_2208 = w[-1].done;
              if (p_Var26 == (_func_void_uv__work_ptr_int *)0x0) {
                p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
              }
              else {
                iVar5 = *(int *)w[-2].wq;
                iVar10 = *(int *)((long)w[-2].wq + 4);
                bVar3 = true;
                p_Var25 = (_func_void_uv__work_ptr_int *)0x0;
                do {
                  while( true ) {
                    p_Var24 = p_Var25;
                    sVar13 = (long)p_Var26 - (long)p_Var24;
                    if (0x1fff < sVar13) {
                      sVar13 = 0x2000;
                    }
                    do {
                      if (bVar3) {
                        sVar16 = pread64(iVar10,local_2038,sVar13,(__off64_t)local_2208);
                      }
                      else {
                        sVar16 = read(iVar10,local_2038,sVar13);
                      }
                    } while ((sVar16 == 0xffffffffffffffff) && (*puVar11 == 4));
                    if (sVar16 == 0) goto LAB_0011501d;
                    if (sVar16 == 0xffffffffffffffff) break;
                    if (0 < (long)sVar16) {
                      lVar22 = 0;
                      sVar13 = sVar16;
LAB_00113fc1:
LAB_00113fd4:
                      do {
                        sVar15 = write(iVar5,local_2038 + lVar22,sVar13);
                        if (sVar15 != -1) goto LAB_00114047;
                        if (*puVar11 != 4) {
                          if (*puVar11 == 0xb) {
                            local_21d0.st_dev._4_2_ = 4;
                            local_21d0.st_dev._6_2_ = 0;
                            local_21d0.st_dev._0_4_ = iVar5;
                            while (iVar4 = poll((pollfd *)&local_21d0,1,-1), iVar4 == -1) {
                              if (*puVar11 != 4) goto LAB_00115007;
                            }
                            if ((local_21d0.st_dev._6_2_ & 0xfffb) == 0) goto LAB_00113fd4;
LAB_00115007:
                            *puVar11 = 5;
                          }
                          p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                          goto LAB_0011501d;
                        }
                      } while( true );
                    }
LAB_0011405e:
                    local_2208 = local_2208 + sVar16;
                    p_Var24 = p_Var24 + sVar16;
                    p_Var25 = p_Var24;
                    if (p_Var26 <= p_Var24) goto LAB_0011501d;
                  }
                  if ((!bVar3) || (p_Var24 != (_func_void_uv__work_ptr_int *)0x0)) break;
                  bVar3 = false;
                  p_Var25 = (_func_void_uv__work_ptr_int *)0x0;
                } while ((*puVar11 == 5) ||
                        (p_Var25 = (_func_void_uv__work_ptr_int *)0x0, *puVar11 == 0x1d));
                p_Var24 = (_func_void_uv__work_ptr_int *)
                          ((ulong)p_Var24 | -(ulong)(p_Var24 == (_func_void_uv__work_ptr_int *)0x0))
                ;
              }
LAB_0011501d:
              if (p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
                w[-1].done = local_2208;
              }
            }
            goto LAB_0011491e;
          }
        }
      }
      p_Var24 = (_func_void_uv__work_ptr_int *)(local_2140.st_dev + -(long)w[-1].done);
      w[-1].done = (_func_void_uv__work_ptr_int *)local_2140.st_dev;
      goto LAB_0011491e;
    case 6:
      p_Var24 = w[-6].done;
      iVar5 = uv__fs_statx(-1,(char *)p_Var24,0,0,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = stat64((char *)p_Var24,(stat64 *)local_2038);
LAB_001145d3:
        if (iVar5 == 0) {
          w[-6].loop = (uv_loop_s *)local_2038._0_8_;
          w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq[1] = local_2028;
          w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
          w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
          w[-5].loop = local_2010;
          w[-5].wq[0] = (void *)local_2038._8_8_;
          w[-5].wq[1] = local_2008;
          w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
          w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(acStack_1ff4,local_1ff8);
          w[-4].wq[1] = local_1ff0;
          w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
          w[-3].done = local_1fe0;
          w[-3].loop = puStack_1fd8;
          w[-3].wq[0] = local_1fd0;
          w[-3].wq[1] = local_1fc8;
          w[-2].work = local_1fd0;
          w[-2].done = local_1fc8;
          w[-4].loop = (uv_loop_s *)0x0;
          w[-4].wq[0] = (void *)0x0;
        }
      }
      break;
    case 7:
      p_Var24 = w[-6].done;
      iVar5 = uv__fs_statx(-1,(char *)p_Var24,0,1,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = lstat64((char *)p_Var24,(stat64 *)local_2038);
        goto LAB_001145d3;
      }
      break;
    case 8:
      iVar10 = *(int *)w[-2].wq;
      iVar5 = uv__fs_statx(iVar10,"",1,0,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = fstat64(iVar10,(stat64 *)local_2038);
        goto LAB_001145d3;
      }
      break;
    case 9:
      iVar5 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      p_Var24 = w[-6].done;
      iVar5 = 0;
      goto LAB_00114176;
    case 0xb:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      iVar5 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
      break;
    case 0xc:
      iVar5 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      iVar5 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      iVar5 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      iVar5 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      iVar5 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      iVar5 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar5 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar5 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar18 = mkdtemp((char *)w[-6].done);
      p_Var24 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar18 == (char *)0x0);
      goto LAB_0011491e;
    case 0x15:
      iVar5 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar5 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar5 == -1) goto LAB_00114959;
      if (iVar5 == 0) {
        free((void *)local_2038._0_8_);
        local_2038._0_8_ = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
LAB_001148f4:
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar5;
      goto LAB_0011491e;
    case 0x17:
      iVar5 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar5 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar17 = pathconf((char *)w[-6].done,4);
      sVar28 = 0x1000;
      if (sVar17 != 0xffffffffffffffff) {
        sVar28 = sVar17;
      }
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(sVar28);
      if (p_Var14 == (_func_void_uv__work_ptr *)0x0) {
        *puVar11 = 0xc;
        p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
        sVar17 = readlink((char *)w[-6].done,(char *)p_Var14,sVar28);
        if (sVar17 == 0xffffffffffffffff) {
          uv__free(p_Var14);
          p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
        else if ((sVar17 == sVar28) &&
                (p_Var14 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var14,sVar17 + 1),
                p_Var14 == (_func_void_uv__work_ptr *)0x0)) {
          p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
        else {
          p_Var14[sVar17] = (_func_void_uv__work_ptr)0x0;
          w[-6].work = p_Var14;
          p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        }
      }
      goto LAB_0011491e;
    case 0x1a:
      iVar5 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar5 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var14 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
LAB_00113e31:
        w[-6].work = p_Var14;
        goto LAB_00114846;
      }
      goto LAB_00114959;
    case 0x1d:
      iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if (iVar5 < 0) goto LAB_001148f4;
      iVar10 = fstat64(iVar5,&local_21d0);
      __mode = local_21d0.st_mode;
      if (iVar10 == 0) {
        uVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                           (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x41,local_21d0.st_mode,
                           (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        uVar6 = uVar9;
        if ((int)uVar9 < 0) {
LAB_00114d45:
          p_Var24 = (_func_void_uv__work_ptr_int *)(ulong)uVar6;
        }
        else {
          if (((ulong)w[-2].wq[0] & 0x100000000) == 0) {
            iVar10 = fstat64(uVar9,&local_2140);
            if (iVar10 != 0) {
LAB_00114ba8:
              p_Var24 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar11;
              goto LAB_00114f6a;
            }
            if (((_func_void_uv__work_ptr_int *)
                 CONCAT26(local_21d0.st_dev._6_2_,
                          CONCAT24(local_21d0.st_dev._4_2_,(int)local_21d0.st_dev)) !=
                 (_func_void_uv__work_ptr_int *)local_2140.st_dev) ||
               (local_21d0.st_ino != local_2140.st_ino)) {
              iVar10 = ftruncate64(uVar9,0);
              if (iVar10 != 0) {
                p_Var24 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar11;
                goto LAB_00114f6a;
              }
              goto LAB_00114e39;
            }
          }
          else {
LAB_00114e39:
            iVar10 = fchmod(uVar9,__mode);
            if (iVar10 == -1) {
              if (*puVar11 != 1) {
                uVar6 = -*puVar11;
                goto LAB_00114d45;
              }
              iVar10 = fstatfs64(uVar9,&local_20b0);
              if ((iVar10 == -1) || ((int)local_20b0.f_type != -0xacb2be)) {
                p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffff;
                goto LAB_00114f6a;
              }
            }
            if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
              iVar10 = ioctl(uVar9,0x40049409,iVar5);
              if (iVar10 == 0) goto LAB_00114f60;
              if (((ulong)w[-2].wq[0] & 0x400000000) != 0) goto LAB_00114ba8;
            }
            p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
            for (sVar28 = local_21d0.st_size; sVar28 != 0; sVar28 = sVar28 - (long)p_Var24) {
              local_2038._8_4_ = 6;
              local_1ff8 = UV_FS_SENDFILE;
              local_1f28 = (char *)0x0;
              local_1f10 = (uv_buf_t *)0x0;
              local_1fd0 = (_func_void_uv__work_ptr *)0x0;
              local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
              puStack_1fd8 = (uv_loop_s *)0x0;
              local_1ff0 = (uv_loop_t *)0x0;
              p_Stack_1fe8 = (uv_fs_cb)0x0;
              local_1f20 = uVar9;
              local_1f1c = iVar5;
              local_1f08 = p_Var26;
              local_1eb8 = sVar28;
              uv__fs_work(&local_1ee8);
              p_Var24 = local_1fe0;
              uv_fs_req_cleanup((uv_fs_t *)local_2038);
              if ((long)p_Var24 < 0) goto LAB_00114f6a;
              p_Var26 = p_Var26 + (long)p_Var24;
            }
          }
LAB_00114f60:
          p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        }
      }
      else {
        p_Var24 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar11;
        uVar9 = 0xffffffff;
      }
LAB_00114f6a:
      iVar4 = (int)p_Var24;
      iVar10 = 0;
      if (iVar4 < 0) {
        iVar10 = iVar4;
      }
      iVar5 = uv__close_nocheckstdio(iVar5);
      if (iVar5 == 0) {
        iVar5 = iVar10;
      }
      if (iVar4 < 0) {
        iVar5 = iVar10;
      }
      if (-1 < (int)uVar9) {
        iVar10 = uv__close_nocheckstdio(uVar9);
        if (iVar10 == 0) {
          iVar10 = iVar5;
        }
        if (iVar5 != 0) {
          iVar10 = iVar5;
        }
        iVar5 = 0;
        if (iVar10 != 0) {
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar5 = iVar10;
        }
      }
      if (iVar5 == 0) {
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        *puVar11 = -iVar5;
        p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      goto LAB_0011491e;
    case 0x1e:
      iVar5 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
        pDVar19 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var14 + 0x30) = pDVar19;
        if (pDVar19 != (DIR *)0x0) {
          w[-6].work = p_Var14;
          goto LAB_00114846;
        }
      }
      uv__free(p_Var14);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00114959:
      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0011491e;
    case 0x20:
      p_Var14 = w[-6].work;
      if (*(long *)(p_Var14 + 8) == 0) {
        uVar9 = 0;
      }
      else {
        uVar27 = 0;
LAB_00114417:
        do {
          *puVar11 = 0;
          dent = readdir64(*(DIR **)(p_Var14 + 0x30));
          uVar9 = (uint)uVar27;
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) {
LAB_00114a23:
              if (uVar9 != 0) {
                lVar22 = 0;
                do {
                  uv__free(*(void **)(*(long *)p_Var14 + lVar22));
                  *(undefined8 *)(*(long *)p_Var14 + lVar22) = 0;
                  lVar22 = lVar22 + 0x10;
                } while (uVar27 << 4 != lVar22);
              }
              uVar9 = 0xffffffff;
            }
            break;
          }
          pcVar18 = dent->d_name;
          iVar5 = strcmp(pcVar18,".");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar18,".."), iVar5 == 0)) {
            if (*(ulong *)(p_Var14 + 8) <= uVar27) break;
            goto LAB_00114417;
          }
          lVar22 = *(long *)p_Var14;
          pcVar18 = uv__strdup(pcVar18);
          *(char **)(lVar22 + uVar27 * 0x10) = pcVar18;
          if (pcVar18 == (char *)0x0) goto LAB_00114a23;
          uVar8 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)(lVar22 + uVar27 * 0x10 + 8) = uVar8;
          uVar9 = uVar9 + 1;
          uVar27 = (ulong)uVar9;
        } while (uVar27 < *(ulong *)(p_Var14 + 8));
      }
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)(int)uVar9;
      goto LAB_0011491e;
    case 0x21:
      p_Var14 = w[-6].work;
      pDVar19 = *(DIR **)(p_Var14 + 0x30);
      if (pDVar19 != (DIR *)0x0) {
        closedir(pDVar19);
        *(undefined8 *)(p_Var14 + 0x30) = 0;
      }
      uv__free(w[-6].work);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00114846:
      p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_0011491e;
    case 0x22:
      iVar5 = statfs64((char *)w[-6].done,(statfs64 *)local_2038);
      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      if (iVar5 == 0) {
        p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
          *(undefined8 *)p_Var14 = local_2038._0_8_;
          *(undefined8 *)(p_Var14 + 8) = local_2038._8_8_;
          *(void **)(p_Var14 + 0x10) = local_2028;
          *(void **)(p_Var14 + 0x18) = local_2020;
          *(long *)(p_Var14 + 0x20) = CONCAT44(iStack_2014,local_2018);
          *(uv_loop_s **)(p_Var14 + 0x28) = local_2010;
          *(void **)(p_Var14 + 0x30) = local_2008;
          goto LAB_00113e31;
        }
        *puVar11 = 0xc;
      }
      goto LAB_0011491e;
    case 0x23:
      p_Var24 = w[-6].done;
      sVar13 = strlen((char *)p_Var24);
      if ((sVar13 < 6) || (iVar5 = strcmp((char *)(p_Var24 + (sVar13 - 6)),"XXXXXX"), iVar5 != 0)) {
        *puVar11 = 0x16;
        iVar5 = -1;
LAB_00113d79:
        if (iVar5 < 0) {
          *p_Var24 = (_func_void_uv__work_ptr_int)0x0;
        }
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp == (_func_int_char_ptr_int *)0x0 ||
            (uv__fs_mkstemp_no_cloexec_support & 1) != 0) {
LAB_00114c01:
          if (w[-7].wq[0] != (void *)0x0) {
            uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
          }
          iVar5 = mkstemp64((char *)p_Var24);
          if ((-1 < iVar5) && (iVar10 = uv__cloexec_ioctl(iVar5,1), iVar10 != 0)) {
            iVar10 = uv__close(iVar5);
            iVar5 = -1;
            if (iVar10 != 0) {
switchD_00113c0c_default:
              abort();
            }
          }
          if (w[-7].wq[0] != (void *)0x0) {
            uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
          }
          goto LAB_00113d79;
        }
        iVar5 = (*uv__mkostemp)((char *)p_Var24,0x80000);
        if (iVar5 < 0) {
          if (*puVar11 != 0x16) goto LAB_00113d79;
          uv__fs_mkstemp_no_cloexec_support = 1;
          goto LAB_00114c01;
        }
      }
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar5;
      goto LAB_0011491e;
    case 0x24:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      p_Var24 = w[-6].done;
      iVar5 = 0x100;
LAB_00114176:
      iVar5 = utimensat(-100,(char *)p_Var24,(timespec *)local_2038,iVar5);
      break;
    default:
      goto switchD_00113c0c_default;
    }
    p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar5;
LAB_0011491e:
    p_Var26 = p_Var24;
    if (p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_001150bc;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar11 == 4));
  p_Var26 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar11;
LAB_001150bc:
  w[-7].wq[1] = p_Var26;
  if ((p_Var24 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)buf;
  }
  return;
LAB_00114047:
  lVar22 = lVar22 + sVar15;
  sVar13 = sVar16 - lVar22;
  if (sVar13 == 0 || (long)sVar16 < lVar22) goto LAB_0011405e;
  goto LAB_00113fc1;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}